

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

LispPTR dremove(LispPTR x,LispPTR l)

{
  ushort uVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  
  while( true ) {
    if ((*(ushort *)((long)MDStypetbl + (ulong)(l >> 8 & 0xfffffffe) ^ 2) & 0x7ff) != 5) {
      return 0;
    }
    LVar3 = car(l);
    pDVar2 = MDStypetbl;
    if (LVar3 != x) break;
    LVar3 = cdr(l);
    if (LVar3 == 0) {
      return 0;
    }
    LVar3 = cdr(l);
    LVar3 = car(LVar3);
    rplaca(l,LVar3);
    LVar3 = cdr(l);
    LVar3 = cdr(LVar3);
    rplacd(l,LVar3);
  }
  LVar3 = cdr(l);
  uVar1 = *(ushort *)((ulong)(pDVar2 + (LVar3 >> 9)) ^ 2);
  LVar3 = l;
  while ((uVar1 & 0x7ff) == 5) {
    LVar4 = cdr(LVar3);
    LVar5 = car(LVar4);
    LVar4 = cdr(LVar3);
    if (LVar5 == x) {
      LVar4 = cdr(LVar4);
      rplacd(LVar3,LVar4);
      LVar4 = LVar3;
    }
    pDVar2 = MDStypetbl;
    LVar3 = cdr(LVar4);
    uVar1 = *(ushort *)((ulong)(pDVar2 + (LVar3 >> 9)) ^ 2);
    LVar3 = LVar4;
  }
  return l;
}

Assistant:

static LispPTR dremove(LispPTR x, LispPTR l) {
  LispPTR z;

  if (Listp(l) == NIL)
    return (NIL);
  else if (x == car(l)) {
    if (cdr(l) != NIL) {
      rplaca(l, car(cdr(l)));
      rplacd(l, cdr(cdr(l)));
      return (dremove(x, l));
    } else 
        return (NIL);
  } else {
    z = l;
  lp:
    if (Listp(cdr(l)) == NIL)
      return (z);
    else if (x == car(cdr(l)))
      rplacd(l, cdr(cdr(l)));
    else
      l = cdr(l);
    goto lp;
  }
}